

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeTableSet<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  undefined1 local_88 [8];
  MaybeResult<wasm::Ok> table;
  undefined1 local_40 [8];
  MaybeResult<wasm::Ok> _val;
  
  maybeTableidx<wasm::WATParser::ParseModuleTypesCtx>((MaybeResult<wasm::Ok> *)local_88,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_40,
             (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
    std::__cxx11::string::string
              ((string *)
               ((long)&table.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
               (string *)local_40);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&table.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&table.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_40);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_40);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeTableSet(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto table = maybeTableidx(ctx);
  CHECK_ERR(table);
  return ctx.makeTableSet(pos, annotations, table.getPtr());
}